

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNStmLabelBase::fold_constants(CTPNStmLabelBase *this,CTcPrsSymtab *symtab)

{
  CTcTokenizer *this_00;
  CTcTokFileDesc *pCVar1;
  long linenum;
  undefined8 in_RSI;
  CTPNStmBase *in_RDI;
  
  this_00 = G_tok;
  pCVar1 = CTPNStmBase::get_source_desc(in_RDI);
  linenum = CTPNStmBase::get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(this_00,pCVar1,linenum);
  if (in_RDI[1].file_ != (CTcTokFileDesc *)0x0) {
    pCVar1 = (CTcTokFileDesc *)
             (**(code **)(*(long *)in_RDI[1].file_ + 0x78))(in_RDI[1].file_,in_RSI);
    in_RDI[1].file_ = pCVar1;
  }
  return &in_RDI->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNStmLabelBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* fold constants in our labeled statement */
    if (stm_ != 0)
        stm_ = (CTPNStm *)stm_->fold_constants(symtab);

    /* we're unchanged by constant folding */
    return this;
}